

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

int __thiscall QXmlStreamReaderPrivate::init(QXmlStreamReaderPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  pointer in_stack_ffffffffffffff78;
  QXmlStreamSimpleStack<unsigned_int> *this_00;
  QXmlStreamSimpleStack<unsigned_int> *in_stack_ffffffffffffff88;
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *this_01;
  QString *in_stack_ffffffffffffff90;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QXmlStreamAttribute> *in_stack_ffffffffffffffc8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->scanDtd = false;
  this->lastAttributeIsCData = false;
  this->token = -1;
  this->token_char = 0;
  this->field_0x3a8 = this->field_0x3a8 & 0xfe;
  this->field_0x3a8 = this->field_0x3a8 | 2;
  this->field_0x3a8 = this->field_0x3a8 & 0xfb;
  this->field_0x3a8 = this->field_0x3a8 & 0xf7;
  this->field_0x3a9 = this->field_0x3a9 & 0xdf;
  this->tos = 0;
  this->resumeReduction = 0;
  iVar1 = this->tos;
  this->tos = iVar1 + 1;
  this->state_stack[iVar1] = 0;
  this->state_stack[this->tos] = 0;
  this_00 = &this->putStack;
  QXmlStreamSimpleStack<unsigned_int>::clear(this_00);
  QXmlStreamSimpleStack<unsigned_int>::reserve(in_stack_ffffffffffffff88,(qsizetype)this_00);
  this_01 = (QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)&this->textBuffer;
  QString::clear((QString *)this_00);
  QString::reserve(in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8);
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::clear
            (&(this->super_QXmlStreamPrivateTagStack).tagStack);
  (this->super_QXmlStreamPrivateTagStack).tagsDone = false;
  QList<QXmlStreamAttribute>::clear((QList<QXmlStreamAttribute> *)this_00);
  QList<QXmlStreamAttribute>::reserve(in_stack_ffffffffffffffc8,in_stack_00000008);
  this->characterOffset = 0;
  this->lastLineStart = 0;
  this->lineNumber = 0;
  this->readBufferPos = 0;
  this->nbytesread = 0;
  QStringDecoder::QStringDecoder((QStringDecoder *)0x646ca6);
  QStringDecoder::operator=((QStringDecoder *)this_00,(QStringDecoder *)in_stack_ffffffffffffff78);
  QStringDecoder::~QStringDecoder((QStringDecoder *)0x646cc6);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::clear(&this->attributeStack);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::reserve(this_01,(qsizetype)this_00);
  std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::reset
            ((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *)
             this_00,in_stack_ffffffffffffff78);
  this->field_0x3a8 = this->field_0x3a8 & 0xef;
  this->field_0x3a8 = this->field_0x3a8 & 0xdf;
  this->field_0x3a8 = this->field_0x3a8 & 0xbf;
  this->atEnd = false;
  this->field_0x3a8 = this->field_0x3a8 & 0x7f;
  this->field_0x3a9 = this->field_0x3a9 & 0xfe;
  this->field_0x3a9 = this->field_0x3a9 & 0xfd;
  this->field_0x3a9 = this->field_0x3a9 & 0xfb;
  this->field_0x3a9 = this->field_0x3a9 & 0xf7;
  this->field_0x3a9 = this->field_0x3a9 | 0x10;
  QByteArray::clear((QByteArray *)0x646d93);
  QByteArray::clear((QByteArray *)0x646da1);
  QString::clear((QString *)this_00);
  (this->super_QXmlStreamPrivateTagStack).tagStackStringStorageSize =
       (this->super_QXmlStreamPrivateTagStack).initialTagStackStringStorageSize;
  this->type = NoToken;
  this->error = NoError;
  this->currentContext = Prolog;
  this->foundDTD = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::init()
{
    scanDtd = false;
    lastAttributeIsCData = false;
    token = -1;
    token_char = 0;
    isEmptyElement = false;
    isWhitespace = true;
    isCDATA = false;
    standalone = false;
    hasStandalone = false;
    tos = 0;
    resumeReduction = 0;
    state_stack[tos++] = 0;
    state_stack[tos] = 0;
    putStack.clear();
    putStack.reserve(32);
    textBuffer.clear();
    textBuffer.reserve(256);
    tagStack.clear();
    tagsDone = false;
    attributes.clear();
    attributes.reserve(16);
    lineNumber = lastLineStart = characterOffset = 0;
    readBufferPos = 0;
    nbytesread = 0;
    decoder = QStringDecoder();
    attributeStack.clear();
    attributeStack.reserve(16);
    entityParser.reset();
    hasCheckedStartDocument = false;
    normalizeLiterals = false;
    hasSeenTag = false;
    atEnd = false;
    inParseEntity = false;
    referenceToUnparsedEntityDetected = false;
    referenceToParameterEntityDetected = false;
    hasExternalDtdSubset = false;
    lockEncoding = false;
    namespaceProcessing = true;
    rawReadBuffer.clear();
    dataBuffer.clear();
    readBuffer.clear();
    tagStackStringStorageSize = initialTagStackStringStorageSize;

    type = QXmlStreamReader::NoToken;
    error = QXmlStreamReader::NoError;
    currentContext = XmlContext::Prolog;
    foundDTD = false;
}